

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publish(Publication *this,string_view field,double val)

{
  string_view valname;
  bool bVar1;
  NamedPoint *in_RDI;
  SmallBuffer db;
  double in_stack_000000d0;
  DataType in_stack_000000dc;
  undefined1 in_stack_000000e0 [16];
  NamedPoint np;
  bool doPublish;
  double in_stack_fffffffffffffec8;
  NamedPoint *in_stack_fffffffffffffed0;
  SmallBuffer *this_00;
  defV *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  Publication *in_stack_fffffffffffffef8;
  ValueFederate *in_stack_ffffffffffffff00;
  bool local_21;
  
  local_21 = in_RDI[1].name.field_2._M_allocated_capacity != 0;
  if ((in_RDI[2].name._M_string_length & 0x100000000) != 0) {
    valname._M_str = (char *)in_stack_ffffffffffffff00;
    valname._M_len = (size_t)in_stack_fffffffffffffef8;
    NamedPoint::NamedPoint
              (in_RDI,valname,(double)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8))
    ;
    bVar1 = changeDetected(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                           in_stack_fffffffffffffec8);
    in_stack_fffffffffffffeef = bVar1;
    if (bVar1) {
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_RDI,(NamedPoint *)CONCAT17(bVar1,in_stack_fffffffffffffee8));
    }
    local_21 = bVar1 && local_21;
    NamedPoint::~NamedPoint((NamedPoint *)0x2c435a);
  }
  if (local_21) {
    typeConvert(in_stack_000000dc,(string_view)in_stack_000000e0,in_stack_000000d0);
    this_00 = (SmallBuffer *)in_RDI[1].name.field_2._M_allocated_capacity;
    data_view::data_view
              ((data_view *)in_RDI,
               (SmallBuffer *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    helics::ValueFederate::publishBytes
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(data_view *)in_RDI);
    data_view::~data_view((data_view *)0x2c43df);
    SmallBuffer::~SmallBuffer(this_00);
  }
  return;
}

Assistant:

void Publication::publish(std::string_view field, double val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        NamedPoint np(field, val);
        if (changeDetected(prevValue, np, delta)) {
            prevValue = std::move(np);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, field, val);
        fed->publishBytes(*this, db);
    }
}